

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAnimatedMeshSceneNode.cpp
# Opt level: O1

void __thiscall
irr::scene::CAnimatedMeshSceneNode::~CAnimatedMeshSceneNode(CAnimatedMeshSceneNode *this,void **vtt)

{
  IAnimationEndCallBack *pIVar1;
  int *piVar2;
  void *pvVar3;
  IAnimationEndCallBack *pIVar4;
  long lVar5;
  IAnimatedMesh *pIVar6;
  _func_int *p_Var7;
  pointer pCVar8;
  pointer ppIVar9;
  
  pvVar3 = *vtt;
  *(void **)this = pvVar3;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar3 + -0x18)) = vtt[5];
  pIVar4 = this->LoopCallBack;
  if (pIVar4 != (IAnimationEndCallBack *)0x0) {
    lVar5 = *(long *)(*(long *)pIVar4 + -0x18);
    pIVar1 = pIVar4 + lVar5 + 0x10;
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)(pIVar4 + lVar5) + 8))();
    }
  }
  pIVar6 = this->Mesh;
  if (pIVar6 != (IAnimatedMesh *)0x0) {
    p_Var7 = (pIVar6->super_IMesh)._vptr_IMesh[-3];
    piVar2 = (int *)(&(pIVar6->super_IMesh).field_0x10 + (long)p_Var7);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      (**(code **)(*(long *)((long)&(pIVar6->super_IMesh)._vptr_IMesh + (long)p_Var7) + 8))();
    }
  }
  pCVar8 = (this->PretransitingSave).m_data.
           super__Vector_base<irr::core::CMatrix4<float>,_std::allocator<irr::core::CMatrix4<float>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pCVar8 != (pointer)0x0) {
    operator_delete(pCVar8,(long)(this->PretransitingSave).m_data.
                                 super__Vector_base<irr::core::CMatrix4<float>,_std::allocator<irr::core::CMatrix4<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pCVar8);
  }
  ppIVar9 = (this->JointChildSceneNodes).m_data.
            super__Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppIVar9 != (pointer)0x0) {
    operator_delete(ppIVar9,(long)(this->JointChildSceneNodes).m_data.
                                  super__Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppIVar9
                   );
  }
  ::std::vector<irr::video::SMaterial,_std::allocator<irr::video::SMaterial>_>::~vector
            (&(this->Materials).m_data);
  ISceneNode::~ISceneNode((ISceneNode *)this,vtt + 2);
  return;
}

Assistant:

CAnimatedMeshSceneNode::~CAnimatedMeshSceneNode()
{
	if (LoopCallBack)
		LoopCallBack->drop();
	if (Mesh)
		Mesh->drop();
}